

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.c
# Opt level: O0

void take_screenshot(SCREENSHOT *ss)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint *in_RDI;
  ALLEGRO_BITMAP *bmp2;
  char buf [64];
  char local_48 [40];
  SCREENSHOT *in_stack_ffffffffffffffe0;
  
  snprintf(local_48,0x40,"%s%04d.%s",*(undefined8 *)(in_RDI + 2),(ulong)*in_RDI,
           *(undefined8 *)(in_RDI + 4));
  uVar1 = al_create_bitmap(screen_width,screen_height);
  al_set_target_bitmap(uVar1);
  uVar2 = al_get_backbuffer(screen);
  al_draw_bitmap(0,uVar2,0);
  al_set_target_backbuffer(screen);
  al_save_bitmap(local_48,uVar1);
  al_destroy_bitmap(uVar1);
  next_screenshot(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void take_screenshot(SCREENSHOT * ss)
{
   char buf[64];
   ALLEGRO_BITMAP *bmp2 = NULL;

   snprintf(buf, sizeof(buf), "%s%04d.%s", ss->name, ss->counter, ss->ext);

   bmp2 = al_create_bitmap(screen_width, screen_height);
   al_set_target_bitmap(bmp2);
   al_draw_bitmap(al_get_backbuffer(screen), 0, 0, 0);
   al_set_target_backbuffer(screen);
   al_save_bitmap(buf, bmp2);
   al_destroy_bitmap(bmp2);

   next_screenshot(ss);
}